

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscPStackEntry.cpp
# Opt level: O1

void __thiscall
CNscPStackEntry::PushStatement(CNscPStackEntry *this,int nLocals,uchar *pauchData,size_t nDataSize)

{
  size_t nSize;
  size_t *psVar1;
  
  nSize = nDataSize + 0x28;
  MakeRoom(this,nSize);
  psVar1 = (size_t *)(this->m_pauchData + this->m_nDataSize);
  *psVar1 = nSize;
  psVar1[1] = 3;
  *(int *)(psVar1 + 2) = nLocals;
  psVar1[4] = 0x28;
  psVar1[3] = nDataSize;
  memcpy(psVar1 + 5,pauchData,nDataSize);
  this->m_nDataSize = this->m_nDataSize + nSize;
  return;
}

Assistant:

void CNscPStackEntry::PushStatement (int nLocals,
	const unsigned char *pauchData, size_t nDataSize)
{

	//
	// Make room for the pcode block
	//

	size_t nSize = sizeof (NscPCodeStatement) + nDataSize;
	MakeRoom (nSize);

	//
	// Initialize the block
	//

	unsigned char *pauchPCode = &m_pauchData [m_nDataSize];
	NscPCodeStatement *p = (NscPCodeStatement *) pauchPCode;
	p ->nOpSize = nSize;
	p ->nOpCode = NscPCode_Statement;
	p ->nType = NscType_Unknown;
	p ->nLocals = nLocals;
	p ->nDataOffset = sizeof (NscPCodeStatement);
	p ->nDataSize = nDataSize;
	memcpy (&pauchPCode [p ->nDataOffset], pauchData, nDataSize);

	//
	// Adjust the size of the entry
	//

	m_nDataSize += nSize;
}